

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCStream_internal
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_CDict *cdict,
                 ZSTD_CCtx_params params,unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params ZVar1;
  ZSTD_compressionParameters cParams;
  ZSTD_CDict *pZVar2;
  size_t sVar3;
  ZSTD_compressionParameters local_8c;
  ZSTD_compressionParameters local_70;
  ZSTD_compressionParameters local_54;
  unsigned_long_long local_38;
  unsigned_long_long pledgedSrcSize_local;
  ZSTD_CDict *cdict_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CStream *zcs_local;
  
  local_38 = pledgedSrcSize;
  pledgedSrcSize_local = (unsigned_long_long)cdict;
  cdict_local = (ZSTD_CDict *)dictSize;
  dictSize_local = (size_t)dict;
  dict_local = zcs;
  ZSTD_getCParamsFromCCtxParams(&local_54,&params,pledgedSrcSize,dictSize);
  ZVar1 = params;
  params.cParams.windowLog = local_54.windowLog;
  params.cParams.chainLog = local_54.chainLog;
  params.cParams.hashLog = local_54.hashLog;
  params.cParams.searchLog = local_54.searchLog;
  params.cParams.minMatch = local_54.minMatch;
  params.cParams.targetLength = local_54.targetLength;
  params = ZVar1;
  params.cParams.strategy = local_54.strategy;
  if ((dictSize_local == 0) || (cdict_local < (ZSTD_CDict *)0x8)) {
    if (pledgedSrcSize_local != 0) {
      ZSTD_getCParamsFromCDict(&local_8c,(ZSTD_CDict *)pledgedSrcSize_local);
      ZVar1 = params;
      params.cParams.windowLog = local_8c.windowLog;
      params.cParams.chainLog = local_8c.chainLog;
      params.cParams.hashLog = local_8c.hashLog;
      params.cParams.searchLog = local_8c.searchLog;
      params.cParams.minMatch = local_8c.minMatch;
      params.cParams.targetLength = local_8c.targetLength;
      params = ZVar1;
      params.cParams.strategy = local_8c.strategy;
    }
    ZSTD_freeCDict(*(ZSTD_CDict **)((long)dict_local + 0x3b0));
    *(undefined8 *)((long)dict_local + 0x3b0) = 0;
    *(unsigned_long_long *)((long)dict_local + 0x3b8) = pledgedSrcSize_local;
  }
  else {
    if (*(long *)((long)dict_local + 0x1b8) != 0) {
      return 0xffffffffffffffc0;
    }
    ZSTD_freeCDict(*(ZSTD_CDict **)((long)dict_local + 0x3b0));
    ZVar1 = params;
    local_70.windowLog = params.cParams.windowLog;
    local_70.chainLog = params.cParams.chainLog;
    params.cParams._8_8_ = ZVar1.cParams._8_8_;
    local_70.hashLog = params.cParams.hashLog;
    local_70.searchLog = params.cParams.searchLog;
    params.cParams._16_8_ = ZVar1.cParams._16_8_;
    local_70.minMatch = params.cParams.minMatch;
    local_70.targetLength = params.cParams.targetLength;
    params.cParams.strategy = ZVar1.cParams.strategy;
    local_70.strategy = params.cParams.strategy;
    params.cParams = ZVar1.cParams;
    cParams = params.cParams;
    params = ZVar1;
    pZVar2 = ZSTD_createCDict_advanced
                       ((void *)dictSize_local,(size_t)cdict_local,ZSTD_dlm_byCopy,ZSTD_dct_auto,
                        cParams,*(ZSTD_customMem *)((long)dict_local + 0x1a0));
    *(ZSTD_CDict **)((long)dict_local + 0x3b0) = pZVar2;
    *(undefined8 *)((long)dict_local + 0x3b8) = *(undefined8 *)((long)dict_local + 0x3b0);
    if (*(long *)((long)dict_local + 0x3b0) == 0) {
      return 0xffffffffffffffc0;
    }
  }
  sVar3 = ZSTD_resetCStream_internal
                    ((ZSTD_CStream *)dict_local,(void *)0x0,0,ZSTD_dct_auto,
                     *(ZSTD_CDict **)((long)dict_local + 0x3b8),params,local_38);
  return sVar3;
}

Assistant:

size_t ZSTD_initCStream_internal(ZSTD_CStream* zcs,
                    const void* dict, size_t dictSize, const ZSTD_CDict* cdict,
                    ZSTD_CCtx_params params, unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_internal");
    params.cParams = ZSTD_getCParamsFromCCtxParams(&params, pledgedSrcSize, dictSize);
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    if (dict && dictSize >= 8) {
        DEBUGLOG(4, "loading dictionary of size %u", (unsigned)dictSize);
        if (zcs->staticSize) {   /* static CCtx : never uses malloc */
            /* incompatible with internal cdict creation */
            return ERROR(memory_allocation);
        }
        ZSTD_freeCDict(zcs->cdictLocal);
        zcs->cdictLocal = ZSTD_createCDict_advanced(dict, dictSize,
                                            ZSTD_dlm_byCopy, ZSTD_dct_auto,
                                            params.cParams, zcs->customMem);
        zcs->cdict = zcs->cdictLocal;
        if (zcs->cdictLocal == NULL) return ERROR(memory_allocation);
    } else {
        if (cdict) {
            params.cParams = ZSTD_getCParamsFromCDict(cdict);  /* cParams are enforced from cdict; it includes windowLog */
        }
        ZSTD_freeCDict(zcs->cdictLocal);
        zcs->cdictLocal = NULL;
        zcs->cdict = cdict;
    }

    return ZSTD_resetCStream_internal(zcs, NULL, 0, ZSTD_dct_auto, zcs->cdict, params, pledgedSrcSize);
}